

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O1

Am_Value_List get_commands_to_undo(Am_Object *cmd)

{
  bool bVar1;
  Am_Value *initial;
  Am_List_Item *extraout_RDX;
  Am_Slot_Key in_SI;
  Am_Value_List AVar2;
  Am_Value value;
  Am_Object local_30;
  Am_Object local_28;
  Am_Value local_20;
  
  Am_Object::Get_Object(&local_28,in_SI,0x170);
  Am_Object::Get_Sibling(&local_30,(Am_Slot_Key)&local_28,(ulong)Am_UNDO_SCROLL_GROUP);
  initial = Am_Object::Get(&local_30,0x169,1);
  Am_Value::Am_Value(&local_20,initial);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&local_28);
  Am_Value_List::Am_Value_List((Am_Value_List *)cmd);
  bVar1 = Am_Value::Valid(&local_20);
  if (bVar1) {
    Am_Value_List::operator=((Am_Value_List *)cmd,&local_20);
  }
  Am_Value::~Am_Value(&local_20);
  AVar2.item = extraout_RDX;
  AVar2.data = (Am_Value_List_Data *)cmd;
  return AVar2;
}

Assistant:

Am_Value_List
get_commands_to_undo(Am_Object cmd)
{
  Am_Value value = cmd.Get_Object(Am_SAVED_OLD_OWNER)
                       .Get_Sibling(Am_UNDO_SCROLL_GROUP)
                       .Peek(Am_VALUE);
  Am_Value_List result;
  if (value.Valid())
    result = value;
  return result;
}